

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphMaker.cc
# Opt level: O1

string * kmer_to_sequence_abi_cxx11_(string *__return_storage_ptr__,uint64_t kmer,uint8_t k)

{
  long lVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (k != '\0') {
    lVar1 = (ulong)k * 2 + 2;
    do {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      lVar1 = lVar1 + -2;
    } while (3 < lVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string kmer_to_sequence(uint64_t kmer, uint8_t k) {
    std::string seq;
    seq.reserve(k);
    for (int shift=(k-1)*2;shift>=0;shift-=2) {
        //std::cout<<"kmer: "
        switch ((kmer>>shift)%4){
            case 0:
                seq.push_back('A');
                break;
            case 1:
                seq.push_back('C');
                break;
            case 2:
                seq.push_back('G');
                break;
            case 3:
                seq.push_back('T');
                break;
        }
    }
    return seq;
}